

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

type_conflict2 dlib::ser_helper::pack_int<unsigned_long_long>(unsigned_long_long item,ostream *out)

{
  uchar i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uchar buf [9];
  
  for (lVar1 = 1; lVar1 != 9; lVar1 = lVar1 + 1) {
    buf[lVar1] = (uchar)item;
    if (item < 0x100) goto LAB_0025f073;
    item = item >> 8;
  }
  lVar1 = 8;
LAB_0025f073:
  buf[0] = (uchar)lVar1;
  uVar3 = (ulong)(byte)(buf[0] + 1);
  uVar2 = (**(code **)(**(long **)(&out->field_0xe8 + (long)out->_vptr_basic_ostream[-3]) + 0x60))
                    (*(long **)(&out->field_0xe8 + (long)out->_vptr_basic_ostream[-3]),buf,uVar3);
  if (uVar2 != uVar3) {
    std::ios::setstate((int)out + (int)out->_vptr_basic_ostream[-3]);
  }
  return uVar2 != uVar3;
}

Assistant:

typename disable_if_c<std::numeric_limits<T>::is_signed,bool>::type pack_int (
            T item,
            std::ostream& out
        )
        /*!
            requires
                - T is an unsigned integral type
            ensures
                - if (no problems occur serializing item) then
                    - writes item to out
                    - returns false
                - else
                    - returns true
        !*/
        {
            COMPILE_TIME_ASSERT(sizeof(T) <= 8);
            unsigned char buf[9];
            unsigned char size = sizeof(T);

            for (unsigned char i = 1; i <= sizeof(T); ++i)
            {
                buf[i] = static_cast<unsigned char>(item&0xFF);                
                item >>= 8;
                if (item == 0) { size = i; break; }
            }

            std::streambuf* sbuf = out.rdbuf();
            buf[0] = size;
            if (sbuf->sputn(reinterpret_cast<char*>(buf),size+1) != size+1)
            {
                out.setstate(std::ios::eofbit | std::ios::badbit);
                return true;
            }

            return false;
        }